

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::ByteSizeLong
          (ImageFeatureType_ImageSizeRange *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  
  if (this->widthrange_ == (SizeRange *)0x0 ||
      this == (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    sVar2 = 0;
  }
  else {
    sVar2 = SizeRange::ByteSizeLong(this->widthrange_);
    uVar4 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->heightrange_ != (SizeRange *)0x0 &&
      this != (ImageFeatureType_ImageSizeRange *)&_ImageFeatureType_ImageSizeRange_default_instance_
     ) {
    sVar3 = SizeRange::ByteSizeLong(this->heightrange_);
    uVar4 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar2 = sVar2 + sVar3 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t ImageFeatureType_ImageSizeRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  size_t total_size = 0;

  // .CoreML.Specification.SizeRange widthRange = 1;
  if (this->has_widthrange()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->widthrange_);
  }

  // .CoreML.Specification.SizeRange heightRange = 2;
  if (this->has_heightrange()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->heightrange_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}